

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::Clear(GeneratedCodeInfo_Annotation *this)

{
  RepeatedField<int> *this_00;
  ulong uVar1;
  anon_union_56_1_493b367e_for_GeneratedCodeInfo_Annotation_10 aVar2;
  int iVar3;
  undefined8 *puVar4;
  bool is_soo;
  LogMessageFatal local_30;
  
  this_00 = &(this->field_0)._impl_.path_;
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  is_soo = ((undefined1  [56])aVar2 & (undefined1  [56])0x4) == (undefined1  [56])0x0;
  internal::SooRep::size(&this_00->soo_rep_,is_soo);
  iVar3 = internal::SooRep::size(&this_00->soo_rep_,is_soo);
  if ((iVar3 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  RepeatedField<int>::set_size
            (this_00,((undefined1  [56])aVar2 & (undefined1  [56])0x4) == (undefined1  [56])0x0,0);
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x20);
    if ((uVar1 & 3) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
                 ,0x20b,"!tagged_ptr_.IsDefault()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
    }
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar4[1] = 0;
    *(undefined1 *)*puVar4 = 0;
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0xe) != (undefined1  [56])0x0) {
    (this->field_0)._impl_.semantic_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void GeneratedCodeInfo_Annotation::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.path_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.source_file_.ClearNonDefaultToEmpty();
  }
  if ((cached_has_bits & 0x0000000eu) != 0) {
    ::memset(&_impl_.begin_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.semantic_) -
        reinterpret_cast<char*>(&_impl_.begin_)) + sizeof(_impl_.semantic_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}